

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

yajl_val yajl_tree_get(yajl_val n,char **path,yajl_type type)

{
  char *__s1;
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  if (path != (char **)0x0) {
    for (; n != (yajl_val)0x0; n = (n->u).object.values[(long)pcVar3]) {
      __s1 = *path;
      if (__s1 == (char *)0x0) {
        if (type == yajl_t_any) {
          return n;
        }
        if (n->type != type) {
          return (yajl_val)0x0;
        }
        return n;
      }
      if (n->type != yajl_t_object) {
        return (yajl_val)0x0;
      }
      pcVar1 = (n->u).number.r;
      pcVar3 = (char *)0x0;
      while( true ) {
        if (pcVar1 == pcVar3) {
          return (yajl_val)0x0;
        }
        iVar2 = strcmp(__s1,*(char **)((n->u).string + (long)pcVar3 * 8));
        if (iVar2 == 0) break;
        pcVar3 = pcVar3 + 1;
      }
      path = path + 1;
    }
  }
  return (yajl_val)0x0;
}

Assistant:

yajl_val yajl_tree_get(yajl_val n, const char ** path, yajl_type type)
{
    if (!path) return NULL;
    while (n && *path) {
        size_t i;
        size_t len;

        if (n->type != yajl_t_object) return NULL;
        len = n->u.object.len;
        for (i = 0; i < len; i++) {
            if (!strcmp(*path, n->u.object.keys[i])) {
                n = n->u.object.values[i];
                break;
            }
        }
        if (i == len) return NULL;
        path++;
    }
    if (n && type != yajl_t_any && type != n->type) n = NULL;
    return n;
}